

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

GCRef * gc_sweep(global_State *g,GCRef *p,uint32_t lim)

{
  byte bVar1;
  GCobj *pGVar2;
  uint32_t uVar3;
  GCobj *o;
  int ow;
  uint32_t lim_local;
  GCRef *p_local;
  global_State *g_local;
  
  bVar1 = (g->gc).currentwhite;
  o._4_4_ = lim;
  _ow = (GCobj *)p;
  while( true ) {
    uVar3 = o._4_4_;
    pGVar2 = *(GCobj **)_ow;
    if (pGVar2 != (GCobj *)0x0) {
      o._4_4_ = o._4_4_ - 1;
    }
    if (pGVar2 == (GCobj *)0x0 || uVar3 == 0) break;
    if ((pGVar2->gch).gct == '\x06') {
      gc_sweep(g,(GCRef *)((long)pGVar2 + 0x40),0xffffffff);
    }
    if ((byte)((*(byte *)((long)pGVar2 + 8) ^ 3) & (bVar1 ^ 3)) == 0) {
      (_ow->gch).nextgc.gcptr64 = (pGVar2->gch).nextgc.gcptr64;
      if (pGVar2 == (GCobj *)(g->gc).root.gcptr64) {
        (g->gc).root.gcptr64 = (pGVar2->gch).nextgc.gcptr64;
      }
      (*gc_freefunc[(pGVar2->gch).gct - 4])(g,pGVar2);
    }
    else {
      *(byte *)((long)pGVar2 + 8) = *(byte *)((long)pGVar2 + 8) & 0xf8 | (g->gc).currentwhite & 3;
      _ow = pGVar2;
    }
  }
  return (GCRef *)_ow;
}

Assistant:

static GCRef *gc_sweep(global_State *g, GCRef *p, uint32_t lim)
{
  /* Mask with other white and LJ_GC_FIXED. Or LJ_GC_SFIXED on shutdown. */
  int ow = otherwhite(g);
  GCobj *o;
  while ((o = gcref(*p)) != NULL && lim-- > 0) {
    if (o->gch.gct == ~LJ_TTHREAD)  /* Need to sweep open upvalues, too. */
      gc_fullsweep(g, &gco2th(o)->openupval);
    if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* Black or current white? */
      lj_assertG(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED),
		 "sweep of undead object");
      makewhite(g, o);  /* Value is alive, change to the current white. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise value is dead, free it. */
      lj_assertG(isdead(g, o) || ow == LJ_GC_SFIXED,
		 "sweep of unlive object");
      setgcrefr(*p, o->gch.nextgc);
      if (o == gcref(g->gc.root))
	setgcrefr(g->gc.root, o->gch.nextgc);  /* Adjust list anchor. */
      gc_freefunc[o->gch.gct - ~LJ_TSTR](g, o);
    }
  }
  return p;
}